

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O3

int ffucrd(fitsfile *fptr,char *keyname,char *card,int *status)

{
  int iVar1;
  int iVar2;
  
  iVar2 = *status;
  if (iVar2 < 1) {
    iVar1 = ffmcrd(fptr,keyname,card,status);
    if (iVar1 == 0xca) {
      *status = iVar2;
      ffprec(fptr,card,status);
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffucrd(fitsfile *fptr,     /* I - FITS file pointer  */
           const char *keyname,/* I - keyword name       */
           const char *card,   /* I - card string value  */
           int *status)        /* IO - error status      */
{
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmcrd(fptr, keyname, card, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        ffprec(fptr, card, status);
    }
    return(*status);
}